

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O0

void __thiscall GoodNess::calcGoodNess(GoodNess *this,double *x,double *y,int count)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  __type _Var1;
  int i;
  double TSS;
  double RSS;
  double ESS;
  double dy;
  double sum0;
  int in_stack_ffffffffffffff9c;
  double in_stack_ffffffffffffffa0;
  int local_4c;
  double local_40;
  double local_38;
  
  local_38 = 0.0;
  local_40 = 0.0;
  for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
  }
  for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
    (**(code **)*in_RDI)(*(undefined8 *)(in_RSI + (long)local_4c * 8));
    _Var1 = std::pow<double,int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_38 = _Var1 + local_38;
    in_stack_ffffffffffffffa0 = *(double *)(in_RDX + (long)local_4c * 8);
    (**(code **)*in_RDI)(*(undefined8 *)(in_RSI + (long)local_4c * 8));
    _Var1 = std::pow<double,int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_40 = _Var1 + local_40;
  }
  local_40 = local_38 + local_40;
  if ((local_40 != 0.0) || (NAN(local_40))) {
    in_RDI[1] = local_38 / local_40;
  }
  else {
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void GoodNess::calcGoodNess(double *x, double *y, int count)
{
    double sum0 = 0.0,dy=0.0;
    double ESS = 0.0; // �ع�ƽ����
    double RSS = 0.0; // �в�ƽ����
    double TSS = 0.0; // ����ƽ����
	int i = 0;

    for(i=0;i<count;i++)
        sum0 += y[i];
    dy = sum0/count;

    for(i=0;i<count;i++)
    {
        ESS += pow(func(x[i]) - dy, 2);
        RSS += pow(y[i] - func(x[i]) ,2);
    }
    TSS = ESS + RSS;
    if(TSS == 0.0)
        goodness = 0.0;
    else
        goodness = ESS / TSS ;
}